

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O3

void __thiscall
llvm::write_hex(llvm *this,raw_ostream *S,uint64_t N,HexPrintStyle Style,
               Optional<unsigned_long> Width)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  undefined4 in_register_0000000c;
  ulong uVar6;
  char *pcVar7;
  char cVar8;
  uint uVar9;
  uint uVar10;
  char NumberBuffer [128];
  undefined8 uStack_90;
  char local_88 [136];
  
  uVar4 = 0x80;
  if (CONCAT44(in_register_0000000c,Style) < 0x80) {
    uVar4 = CONCAT44(in_register_0000000c,Style);
  }
  if (S == (raw_ostream *)0x0) {
    uVar6 = 0x40;
  }
  else {
    uVar6 = 0x3f;
    if (S != (raw_ostream *)0x0) {
      for (; (ulong)S >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar6 = uVar6 ^ 0x3f;
  }
  uVar5 = (uint)N & 0xfffffffe;
  uVar9 = 0;
  if (((undefined1  [16])Width.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    uVar9 = (uint)uVar4;
  }
  uVar10 = (uint)(0x43 - uVar6 >> 2);
  uVar3 = 1;
  if (1 < uVar10) {
    uVar3 = uVar10;
  }
  uVar3 = uVar3 + (uint)(uVar5 == 2) * 2;
  if (uVar9 <= uVar3) {
    uVar9 = uVar3;
  }
  builtin_strncpy(local_88 + 0x70,"0000000000000000",0x10);
  builtin_strncpy(local_88 + 0x60,"0000000000000000",0x10);
  builtin_strncpy(local_88 + 0x50,"0000000000000000",0x10);
  builtin_strncpy(local_88 + 0x40,"0000000000000000",0x10);
  builtin_strncpy(local_88 + 0x30,"0000000000000000",0x10);
  builtin_strncpy(local_88 + 0x20,"0000000000000000",0x10);
  builtin_strncpy(local_88 + 0x10,"0000000000000000",0x10);
  builtin_strncpy(local_88,"0000000000000000",0x10);
  if (uVar5 == 2) {
    builtin_strncpy(local_88,"0x000000",8);
  }
  if (S != (raw_ostream *)0x0) {
    uVar5 = (uint)((N & 0xfffffffd) != 0) * 0x20 + 0x37;
    pcVar7 = (char *)((long)&uStack_90 + 7 + (long)(ulong)uVar9);
    do {
      uVar3 = (uint)S & 0xf;
      cVar2 = (char)uVar3;
      cVar8 = cVar2 + '0';
      if (9 < uVar3) {
        cVar8 = (char)uVar5 + cVar2;
      }
      *pcVar7 = cVar8;
      pcVar7 = pcVar7 + -1;
      bVar1 = (raw_ostream *)0xf < S;
      S = (raw_ostream *)((ulong)S >> 4);
    } while (bVar1);
  }
  uStack_90 = 0x14bac1;
  raw_ostream::write((raw_ostream *)this,(int)local_88,(void *)(ulong)uVar9,(ulong)uVar5);
  return;
}

Assistant:

void llvm::write_hex(raw_ostream &S, uint64_t N, HexPrintStyle Style,
                     Optional<size_t> Width) {
  const size_t kMaxWidth = 128u;

  size_t W = std::min(kMaxWidth, Width.getValueOr(0u));

  unsigned Nibbles = (64 - countLeadingZeros(N) + 3) / 4;
  bool Prefix = (Style == HexPrintStyle::PrefixLower ||
                 Style == HexPrintStyle::PrefixUpper);
  bool Upper =
      (Style == HexPrintStyle::Upper || Style == HexPrintStyle::PrefixUpper);
  unsigned PrefixChars = Prefix ? 2 : 0;
  unsigned NumChars =
      std::max(static_cast<unsigned>(W), std::max(1u, Nibbles) + PrefixChars);

  char NumberBuffer[kMaxWidth];
  ::memset(NumberBuffer, '0', llvm::array_lengthof(NumberBuffer));
  if (Prefix)
    NumberBuffer[1] = 'x';
  char *EndPtr = NumberBuffer + NumChars;
  char *CurPtr = EndPtr;
  while (N) {
    unsigned char x = static_cast<unsigned char>(N) % 16;
    *--CurPtr = hexdigit(x, !Upper);
    N /= 16;
  }

  S.write(NumberBuffer, NumChars);
}